

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderHeatmap<unsigned_long_long,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,unsigned_long_long *values,
               int rows,int cols,double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min
               ,ImPlotPoint *bounds_max,bool reverse_y)

{
  float fVar1;
  ulong uVar2;
  ImPlotPlot *pIVar3;
  ImVec2 IVar4;
  ImPlotContext *pIVar5;
  ImPlotContext *pIVar6;
  unsigned_long_long *puVar7;
  ImU32 col;
  ulong uVar8;
  ImPlotPoint *pIVar9;
  ulong uVar10;
  ImPlotContext *gp;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  double in_XMM1_Qb;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar16 [16];
  double dVar18;
  double dVar19;
  ImVec4 IVar20;
  GetterHeatmap<unsigned_long_long> getter;
  ImVec2 b;
  ImVec2 local_198;
  double local_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  double local_178;
  double dStack_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  double local_140;
  double local_138;
  unsigned_long_long *local_130;
  double local_128;
  double local_120;
  long local_118;
  long local_110;
  double local_108;
  double local_100;
  char *local_f8;
  ImDrawList *local_f0;
  unsigned_long_long *local_e8;
  double local_e0;
  GetterHeatmap<unsigned_long_long> local_d8;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLin> local_78;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  
  pIVar5 = GImPlot;
  dVar17 = (double)CONCAT44(in_XMM0_Dd,in_XMM0_Dc);
  if ((((scale_min == 0.0) && (dVar17 = (double)CONCAT44(in_XMM0_Dd,in_XMM0_Dc), !NAN(scale_min)))
      && (dVar17 = (double)CONCAT44(in_XMM0_Dd,in_XMM0_Dc), scale_max == 0.0)) &&
     (dVar17 = (double)CONCAT44(in_XMM0_Dd,in_XMM0_Dc), !NAN(scale_max))) {
    uVar8 = *values;
    uVar10 = uVar8;
    if (1 < cols * rows) {
      uVar14 = 1;
      do {
        uVar2 = values[uVar14];
        if (uVar2 < uVar10) {
          uVar10 = uVar2;
        }
        if (uVar8 < uVar2) {
          uVar8 = uVar2;
        }
        uVar14 = uVar14 + 1;
      } while ((uint)(cols * rows) != uVar14);
    }
    auVar15._8_4_ = (int)(uVar10 >> 0x20);
    auVar15._0_8_ = uVar10;
    auVar15._12_4_ = 0x45300000;
    dVar17 = auVar15._8_8_ - 1.9342813113834067e+25;
    scale_min = dVar17 + ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
    auVar16._8_4_ = (int)(uVar8 >> 0x20);
    auVar16._0_8_ = uVar8;
    auVar16._12_4_ = 0x45300000;
    in_XMM1_Qb = auVar16._8_8_ - 1.9342813113834067e+25;
    scale_max = in_XMM1_Qb + ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
  }
  if ((scale_min == scale_max) && (!NAN(scale_min) && !NAN(scale_max))) {
    dVar19 = log10(bounds_min->y / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
    pIVar6 = GImPlot;
    pIVar3 = pIVar5->CurrentPlot;
    dVar17 = pIVar3->YAxis[transformer.YAxis].Range.Min;
    local_d8.Values =
         (unsigned_long_long *)
         CONCAT44((float)((((double)(float)(dVar19 / pIVar5->LogDenY[transformer.YAxis]) *
                            (pIVar3->YAxis[transformer.YAxis].Range.Max - dVar17) + dVar17) - dVar17
                          ) * pIVar5->My[transformer.YAxis] +
                         (double)pIVar5->PixelRange[transformer.YAxis].Min.y),
                  (float)((bounds_min->x - (pIVar3->XAxis).Range.Min) * pIVar5->Mx +
                         (double)pIVar5->PixelRange[transformer.YAxis].Min.x));
    dVar19 = log10(bounds_max->y / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
    pIVar3 = pIVar6->CurrentPlot;
    dVar17 = pIVar3->YAxis[transformer.YAxis].Range.Min;
    local_78.Getter =
         (GetterHeatmap<unsigned_long_long> *)
         CONCAT44((float)((((double)(float)(dVar19 / pIVar6->LogDenY[transformer.YAxis]) *
                            (pIVar3->YAxis[transformer.YAxis].Range.Max - dVar17) + dVar17) - dVar17
                          ) * pIVar6->My[transformer.YAxis] +
                         (double)pIVar6->PixelRange[transformer.YAxis].Min.y),
                  (float)((bounds_max->x - (pIVar3->XAxis).Range.Min) * pIVar6->Mx +
                         (double)pIVar6->PixelRange[transformer.YAxis].Min.x));
    col = GetColormapColorU32(0,(pIVar5->Style).Colormap);
    ImDrawList::AddRectFilled(DrawList,(ImVec2 *)&local_d8,(ImVec2 *)&local_78,col,0.0,0);
    return;
  }
  if (reverse_y) {
    dVar19 = -1.0;
    pIVar9 = bounds_max;
  }
  else {
    dVar19 = 1.0;
    pIVar9 = bounds_min;
  }
  local_128 = pIVar9->y;
  local_d8.XRef = bounds_min->x;
  local_190 = (double)cols;
  local_d8.Width = (bounds_max->x - local_d8.XRef) / local_190;
  local_158._8_8_ = local_158._0_8_;
  local_158._0_8_ = (double)rows;
  local_d8.Height = (bounds_max->y - bounds_min->y) / (double)rows;
  local_d8.Count = cols * rows;
  local_d8.HalfSize.x = local_d8.Width * 0.5;
  local_d8.HalfSize.y = local_d8.Height * 0.5;
  pIVar3 = GImPlot->CurrentPlot;
  fVar1 = (float)pIVar3->CurrentYAxis;
  local_168._8_4_ = SUB84(dVar17,0);
  local_168._0_8_ = scale_min;
  local_168._12_4_ = (int)((ulong)dVar17 >> 0x20);
  local_d8.Values = values;
  local_d8.Rows = rows;
  local_d8.Cols = cols;
  local_d8.ScaleMin = scale_min;
  local_d8.ScaleMax = scale_max;
  local_d8.YRef = local_128;
  local_d8.YDir = dVar19;
  local_178 = scale_max;
  dStack_170 = in_XMM1_Qb;
  switch(GImPlot->Scales[(int)fVar1]) {
  case 0:
    local_78.Transformer = (TransformerLinLin *)&local_198;
    local_198.x = fVar1;
    local_78.Getter = &local_d8;
    local_78.Prims = local_d8.Count;
    RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLinLin>>
              (&local_78,DrawList,&pIVar3->PlotRect);
    break;
  case 1:
    local_78.Transformer = (TransformerLinLin *)&local_198;
    local_198.x = fVar1;
    local_78.Getter = &local_d8;
    local_78.Prims = local_d8.Count;
    RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLogLin>>
              ((RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLin> *
               )&local_78,DrawList,&pIVar3->PlotRect);
    break;
  case 2:
    local_78.Transformer = (TransformerLinLin *)&local_198;
    local_198.x = fVar1;
    local_78.Getter = &local_d8;
    local_78.Prims = local_d8.Count;
    RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLog> *
               )&local_78,DrawList,&pIVar3->PlotRect);
    break;
  case 3:
    local_78.Transformer = (TransformerLinLin *)&local_198;
    local_198.x = fVar1;
    local_78.Getter = &local_d8;
    local_78.Prims = local_d8.Count;
    RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLogLog>>
              ((RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLog> *
               )&local_78,DrawList,&pIVar3->PlotRect);
    break;
  default:
    goto switchD_0023be24_default;
  }
  scale_min = (double)local_168._0_8_;
  scale_max = local_178;
  in_XMM1_Qb = dStack_170;
switchD_0023be24_default:
  if ((fmt != (char *)0x0) && (0 < rows)) {
    dVar17 = (bounds_max->x - bounds_min->x) / local_190;
    local_138 = (bounds_max->y - bounds_min->y) / (double)local_158._0_8_;
    lVar11 = (long)transformer.YAxis;
    local_178 = scale_max - scale_min;
    local_140 = local_138 * 0.5;
    dVar18 = dVar17 * 0.5;
    local_110 = lVar11 << 4;
    local_120 = 0.0;
    local_17c = 0;
    local_180 = 0;
    local_188 = rows;
    local_184 = cols;
    dStack_170 = in_XMM1_Qb;
    local_130 = values;
    local_118 = lVar11;
    local_108 = dVar18;
    local_100 = dVar17;
    local_f8 = fmt;
    local_f0 = DrawList;
    iVar12 = cols;
    do {
      if (0 < iVar12) {
        local_e0 = (local_138 * local_120 + local_140) * dVar19 + local_128;
        local_e8 = values + local_180;
        local_190 = 0.0;
        lVar13 = 0;
        do {
          pIVar5 = GImPlot;
          local_158._0_8_ = local_190 * dVar17 + bounds_min->x + dVar18;
          dVar18 = log10(local_e0 / GImPlot->CurrentPlot->YAxis[lVar11].Range.Min);
          puVar7 = local_e8;
          pIVar3 = pIVar5->CurrentPlot;
          dVar17 = pIVar3->YAxis[lVar11].Range.Min;
          local_158 = ZEXT416((uint)(float)(((double)local_158._0_8_ - (pIVar3->XAxis).Range.Min) *
                                            pIVar5->Mx +
                                           (double)*(float *)((long)&pIVar5->PixelRange[0].Min.x +
                                                             local_110)));
          dVar17 = (((double)(float)(dVar18 / pIVar5->LogDenY[local_118]) *
                     (pIVar3->YAxis[lVar11].Range.Max - dVar17) + dVar17) - dVar17) *
                   pIVar5->My[local_118] +
                   (double)*(float *)((long)&pIVar5->PixelRange[0].Min.y + local_110);
          uStack_44 = (undefined4)((ulong)dVar17 >> 0x20);
          local_48 = (float)dVar17;
          sprintf((char *)&local_78,local_f8,local_e8[lVar13]);
          IVar4 = ImGui::CalcTextSize((char *)&local_78,(char *)0x0,false,-1.0);
          local_58._8_4_ = extraout_XMM0_Dc;
          local_58._0_4_ = IVar4.x;
          local_58._4_4_ = IVar4.y;
          local_58._12_4_ = extraout_XMM0_Dd;
          dVar18 = ((((double)CONCAT44(0x45300000,(int)(puVar7[lVar13] >> 0x20)) -
                     1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)puVar7[lVar13]) - 4503599627370496.0)) -
                   (double)local_168._0_8_) / local_178;
          dVar17 = 1.0;
          if (dVar18 <= 1.0) {
            dVar17 = dVar18;
          }
          IVar20 = SampleColormap((float)(double)(~-(ulong)(dVar18 < 0.0) & (ulong)dVar17),-1);
          local_198.x = local_158._0_4_ - (float)local_58._0_4_ * 0.5;
          local_198.y = local_48 - (float)local_58._4_4_ * 0.5;
          ImDrawList::AddText(local_f0,&local_198,
                              -(uint)(IVar20.z * 0.114 + IVar20.x * 0.299 + IVar20.y * 0.587 <= 0.5)
                              | 0xff000000,(char *)&local_78,(char *)0x0);
          local_190 = local_190 + 1.0;
          lVar13 = lVar13 + 1;
          dVar18 = local_108;
          dVar17 = local_100;
        } while (cols != (int)lVar13);
        local_180 = local_180 + (int)lVar13;
        values = local_130;
        rows = local_188;
        iVar12 = local_184;
      }
      local_120 = local_120 + 1.0;
      local_17c = local_17c + 1;
    } while (local_17c != rows);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}